

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verilogAST.hpp
# Opt level: O1

void __thiscall verilogAST::SingleLineComment::~SingleLineComment(SingleLineComment *this)

{
  Statement *pSVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  *(undefined ***)this = &PTR_toString_abi_cxx11__00176978;
  *(undefined ***)&this->super_BehavioralStatement = &PTR_toString_abi_cxx11__001769a0;
  pSVar1 = (this->statement)._M_t.
           super___uniq_ptr_impl<verilogAST::Statement,_std::default_delete<verilogAST::Statement>_>
           ._M_t.
           super__Tuple_impl<0UL,_verilogAST::Statement_*,_std::default_delete<verilogAST::Statement>_>
           .super__Head_base<0UL,_verilogAST::Statement_*,_false>._M_head_impl;
  if (pSVar1 != (Statement *)0x0) {
    (**(code **)(*(long *)pSVar1 + 0x10))();
  }
  (this->statement)._M_t.
  super___uniq_ptr_impl<verilogAST::Statement,_std::default_delete<verilogAST::Statement>_>._M_t.
  super__Tuple_impl<0UL,_verilogAST::Statement_*,_std::default_delete<verilogAST::Statement>_>.
  super__Head_base<0UL,_verilogAST::Statement_*,_false>._M_head_impl = (Statement *)0x0;
  pcVar2 = (this->value)._M_dataplus._M_p;
  paVar3 = &(this->value).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~SingleLineComment(){}